

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

bool density_tests::detail::
     PutTestObject<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>,_128UL,_8UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  double dVar1;
  TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>
  type;
  ElementType source;
  runtime_type local_98;
  TestObject<128UL,_8UL> local_90;
  
  dVar1 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&i_rand->m_rand);
  if (dVar1 < 0.9) {
    TestObject<128UL,_8UL>::TestObject(&local_90);
    density::
    sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::emplace<density_tests::TestObject<128ul,8ul>,density_tests::TestObject<128ul,8ul>>
              ((sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)queue,&local_90);
    TestObject<128UL,_8UL>::~TestObject(&local_90);
  }
  else {
    InstanceCounted::new_instance((InstanceCounted *)&local_98);
    local_98.m_underlying_type.m_feature_table =
         (UnderlyingType)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<128ul,8ul>>
         ::s_table;
    TestObject<128UL,_8UL>::TestObject(&local_90);
    density::
    sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::dyn_push_copy((sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                     *)queue,&local_98,&local_90);
    TestObject<128UL,_8UL>::~TestObject(&local_90);
    InstanceCounted::~InstanceCounted((InstanceCounted *)&local_98);
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }